

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_page_element * nk_create_page_element(nk_context *ctx)

{
  nk_page *pnVar1;
  nk_page_element *__s;
  ulong uVar2;
  nk_page_element *__s_00;
  size_t __n;
  size_t __n_00;
  
  __s = ctx->freelist;
  if (__s == (nk_page_element *)0x0) {
    if (ctx->use_pool == 0) {
      __s = (nk_page_element *)nk_buffer_alloc(&ctx->memory,NK_BUFFER_BACK,0x200,8);
      if (__s == (nk_page_element *)0x0) {
        return (nk_page_element *)0x0;
      }
    }
    else {
      pnVar1 = (ctx->pool).pages;
      if ((pnVar1 == (nk_page *)0x0) ||
         (uVar2 = (ulong)pnVar1->size, (ctx->pool).capacity <= pnVar1->size)) {
        uVar2 = 0;
        if ((ctx->pool).type == NK_BUFFER_FIXED) {
          return (nk_page_element *)0x0;
        }
        pnVar1 = (nk_page *)
                 (*(ctx->pool).alloc.alloc)
                           ((ctx->pool).alloc.userdata,(void *)0x0,
                            (ulong)((ctx->pool).capacity - 1) * 0x200 + 0x210);
        pnVar1->next = (ctx->pool).pages;
        (ctx->pool).pages = pnVar1;
        pnVar1->size = 0;
      }
      pnVar1->size = (int)uVar2 + 1;
      __s = pnVar1->win + uVar2;
    }
  }
  else {
    ctx->freelist = __s->next;
  }
  __n = (ulong)__s & 3;
  if (__n == 0) {
    __n = 0x1f0;
    __s_00 = __s;
  }
  else {
    __n_00 = -__n + 4;
    memset(__s,0,__n_00);
    memset((void *)((long)__s + __n_00),0,0x1fc);
    __s_00 = (nk_page_element *)((long)__s + -__n + 0x200);
  }
  memset(__s_00,0,__n);
  __s->next = (nk_page_element *)0x0;
  __s->prev = (nk_page_element *)0x0;
  return __s;
}

Assistant:

NK_LIB struct nk_page_element*
nk_create_page_element(struct nk_context *ctx)
{
struct nk_page_element *elem;
if (ctx->freelist) {
/* unlink page element from free list */
elem = ctx->freelist;
ctx->freelist = elem->next;
} else if (ctx->use_pool) {
/* allocate page element from memory pool */
elem = nk_pool_alloc(&ctx->pool);
NK_ASSERT(elem);
if (!elem) return 0;
} else {
/* allocate new page element from back of fixed size memory buffer */
NK_STORAGE const nk_size size = sizeof(struct nk_page_element);
NK_STORAGE const nk_size align = NK_ALIGNOF(struct nk_page_element);
elem = (struct nk_page_element*)nk_buffer_alloc(&ctx->memory, NK_BUFFER_BACK, size, align);
NK_ASSERT(elem);
if (!elem) return 0;
}
nk_zero_struct(*elem);
elem->next = 0;
elem->prev = 0;
return elem;
}